

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

_Bool parse_path_coordinates(char **begin,char *end,float *values,int offset,int count)

{
  byte *pbVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  bVar7 = count < 1;
  if (count < 1) {
    return bVar7;
  }
  uVar6 = 0;
  do {
    pbVar1 = (byte *)*begin;
    if (pbVar1 < end) {
      if (*pbVar1 != 0x2d) {
        if (*pbVar1 == 0x2b) {
          pbVar1 = pbVar1 + 1;
        }
        goto LAB_0012c96b;
      }
      pbVar1 = pbVar1 + 1;
      fVar8 = -1.0;
    }
    else {
LAB_0012c96b:
      fVar8 = 1.0;
    }
    if (end <= pbVar1) {
      return bVar7;
    }
    bVar2 = *pbVar1 - 0x30;
    if (*pbVar1 != 0x2e && 9 < bVar2) {
      return bVar7;
    }
    fVar11 = 0.0;
    if (bVar2 < 10) {
      pcVar3 = end + ~(ulong)pbVar1;
      fVar10 = 0.0;
      pbVar5 = pbVar1;
      do {
        fVar10 = fVar10 * 10.0 + (float)((char)*pbVar5 + -0x30);
        pbVar1 = (byte *)end;
        if (pcVar3 == (char *)0x0) break;
        pbVar4 = pbVar5 + 1;
        pbVar1 = pbVar5 + 1;
        pcVar3 = pcVar3 + -1;
        pbVar5 = pbVar1;
      } while ((byte)(*pbVar4 - 0x30) < 10);
    }
    else {
      fVar10 = 0.0;
    }
    if ((pbVar1 < end) && (*pbVar1 == 0x2e)) {
      pbVar5 = pbVar1 + 1;
      if (end <= pbVar5) {
        return bVar7;
      }
      if (9 < (byte)(*pbVar5 - 0x30)) {
        return bVar7;
      }
      pcVar3 = end + (-2 - (long)pbVar1);
      fVar11 = 0.0;
      fVar9 = 1.0;
      do {
        fVar11 = fVar11 * 10.0 + (float)((char)*pbVar5 + -0x30);
        fVar9 = fVar9 * 10.0;
        pbVar1 = (byte *)end;
        if (pcVar3 == (char *)0x0) break;
        pbVar4 = pbVar5 + 1;
        pbVar1 = pbVar5 + 1;
        pcVar3 = pcVar3 + -1;
        pbVar5 = pbVar1;
      } while ((byte)(*pbVar4 - 0x30) < 10);
      fVar11 = fVar11 / fVar9;
    }
    fVar9 = 0.0;
    if ((pbVar1 < end) && ((*pbVar1 | 0x20) == 0x65)) {
      pbVar5 = pbVar1 + 1;
      pbVar4 = pbVar5;
      if (pbVar5 < end) {
        bVar2 = *pbVar5;
        pbVar4 = pbVar1 + 2;
        if (bVar2 == 0x2b) goto LAB_0012ca85;
        pbVar4 = pbVar5;
        if (bVar2 == 0x2d) {
          pbVar4 = pbVar1 + 2;
        }
        fVar12 = *(float *)(&DAT_001450e0 + (ulong)(bVar2 == 0x2d) * 4);
      }
      else {
LAB_0012ca85:
        fVar12 = 1.0;
      }
      if (end <= pbVar4) {
        return bVar7;
      }
      if (9 < (byte)(*pbVar4 - 0x30)) {
        return bVar7;
      }
      pcVar3 = end + ~(ulong)pbVar4;
      do {
        fVar9 = fVar9 * 10.0 + (float)((char)*pbVar4 + -0x30);
        pbVar1 = (byte *)end;
        if (pcVar3 == (char *)0x0) break;
        pbVar5 = pbVar4 + 1;
        pbVar1 = pbVar4 + 1;
        pcVar3 = pcVar3 + -1;
        pbVar4 = pbVar1;
      } while ((byte)(*pbVar5 - 0x30) < 10);
    }
    else {
      fVar12 = 1.0;
    }
    *begin = (char *)pbVar1;
    values[(uint)offset + uVar6] = fVar8 * (fVar10 + fVar11);
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      fVar8 = powf(10.0,fVar9 * fVar12);
      values[(uint)offset + uVar6] = fVar8 * values[(uint)offset + uVar6];
    }
    if (3.4028235e+38 < ABS(values[(uint)offset + uVar6])) {
      return bVar7;
    }
    pbVar1 = (byte *)*begin;
    bVar7 = pbVar1 < end;
    pbVar5 = pbVar1;
    if (bVar7) {
      bVar7 = true;
      pbVar4 = pbVar1;
      do {
        pbVar5 = pbVar4;
        if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0)) break;
        pbVar4 = pbVar4 + 1;
        bVar7 = pbVar4 < end;
        pbVar5 = (byte *)end;
      } while (pbVar4 != (byte *)end);
    }
    pbVar4 = pbVar5;
    if (bVar7) {
      bVar7 = false;
      if (pbVar5 < end) {
        bVar7 = *pbVar5 == 0x2c;
        pbVar5 = pbVar5 + bVar7;
      }
      pbVar4 = pbVar5;
      if ((bool)(pbVar5 < end & bVar7)) {
        do {
          pbVar4 = pbVar5;
          if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
          break;
          pbVar5 = pbVar5 + 1;
          pbVar4 = (byte *)end;
        } while (pbVar5 != (byte *)end);
      }
    }
    if (pbVar4 != pbVar1) {
      *begin = (char *)pbVar4;
    }
    uVar6 = uVar6 + 1;
    bVar7 = (uint)count <= uVar6;
    if (uVar6 == (uint)count) {
      return bVar7;
    }
  } while( true );
}

Assistant:

static inline bool parse_path_coordinates(const char** begin, const char* end, float values[6], int offset, int count)
{
    for(int i = 0; i < count; i++) {
        if(!plutovg_parse_number(begin, end, values + offset + i))
            return false;
        plutovg_skip_ws_or_comma(begin, end, NULL);
    }

    return true;
}